

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O2

void __thiscall Fl_Text_Editor::Fl_Text_Editor(Fl_Text_Editor *this,int X,int Y,int W,int H,char *l)

{
  byte *pbVar1;
  
  Fl_Text_Display::Fl_Text_Display(&this->super_Fl_Text_Display,X,Y,W,H,l);
  (this->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Text_Editor_002796e0;
  (this->super_Fl_Text_Display).mCursorOn = 1;
  this->insert_mode_ = 1;
  this->key_bindings = (Key_Binding *)0x0;
  pbVar1 = (byte *)((long)&(this->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.flags_ + 2);
  *pbVar1 = *pbVar1 | 8;
  add_default_key_bindings(this,&this->key_bindings);
  this->default_key_function_ = kf_default;
  return;
}

Assistant:

Fl_Text_Editor::Fl_Text_Editor(int X, int Y, int W, int H,  const char* l)
    : Fl_Text_Display(X, Y, W, H, l) {
  mCursorOn = 1;
  insert_mode_ = 1;
  key_bindings = 0;
  set_flag(MAC_USE_ACCENTS_MENU);

  // handle the default key bindings
  add_default_key_bindings(&key_bindings);

  // handle everything else
  default_key_function(kf_default);
}